

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O2

void __thiscall OmegaOP::algoChannel(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  OmegaOP *pOVar4;
  double **ppdVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  Costs cost;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  OmegaOP *local_a0;
  ulong local_98;
  void *local_90;
  double local_88;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  double theV;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  double local_40;
  long local_38;
  
  uVar14 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar8 = this->nbStates;
  Costs::Costs(&cost);
  ppdVar5 = preprocessing(this,data);
  this->S12P = ppdVar5;
  local_50 = (ulong)((int)uVar14 + 1);
  uVar11 = local_50 * 4;
  local_a0 = this;
  local_60 = uVar14;
  pvVar6 = operator_new__(uVar11);
  local_90 = operator_new__(uVar11);
  theV = 0.0;
  local_78 = (ulong)(uVar8 - 1);
  local_58 = local_78 - 1;
  uVar13 = 0;
  local_b0 = 2;
  local_98 = (ulong)uVar8;
  local_48 = pvVar6;
  do {
    if ((uint)local_50 <= local_b0) {
      local_a0->pruning =
           ((double)uVar13 + (double)uVar13) /
           ((double)((int)local_60 - 1) *
           (double)(local_60 & 0xffffffff) *
           (double)(local_98 & 0xffffffff) * (double)(local_98 & 0xffffffff));
      operator_delete__(pvVar6);
      operator_delete__(local_90);
      return;
    }
    ppdVar5 = local_a0->Q;
    uVar11 = (ulong)(local_b0 - 1);
    uVar14 = 0;
    do {
      if (local_78 == uVar14) {
        iVar7 = (int)local_78;
        goto LAB_0010ab1e;
      }
      ppdVar1 = ppdVar5 + uVar14;
      lVar12 = uVar14 + 1;
      uVar14 = uVar14 + 1;
    } while (ppdVar5[lVar12][uVar11] <= (*ppdVar1)[uVar11] &&
             (*ppdVar1)[uVar11] != ppdVar5[lVar12][uVar11]);
    iVar7 = (int)uVar14 + -1;
LAB_0010ab1e:
    *(int *)((long)pvVar6 + uVar11 * 4) = iVar7;
    uVar14 = local_98;
    uVar9 = local_58;
    do {
      if (uVar9 == 0xffffffffffffffff) {
        uVar8 = 0;
        break;
      }
      lVar12 = uVar9 + 1;
      uVar10 = uVar9 & 0xffffffff;
      uVar8 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar8;
      uVar9 = uVar9 - 1;
    } while (ppdVar5[uVar10][uVar11] <= ppdVar5[lVar12][uVar11] &&
             ppdVar5[lVar12][uVar11] != ppdVar5[uVar10][uVar11]);
    *(uint *)((long)local_90 + uVar11 * 4) = uVar8;
    for (uVar11 = 0; uVar11 != local_98; uVar11 = uVar11 + 1) {
      local_a8 = 0;
      uVar14 = 1;
      local_88 = INFINITY;
      local_a4 = 0;
      local_70 = uVar11;
      while( true ) {
        pOVar4 = local_a0;
        local_ac = (uint)uVar14;
        uVar9 = (ulong)local_b0;
        if (local_b0 <= local_ac) break;
        if (local_ac < local_b0 - 1) {
          pdVar2 = *local_a0->S12P;
          pdVar3 = local_a0->S12P[2];
          theV = Costs::vhat(&cost,local_a0->states + uVar11,&local_ac,&local_b0,pdVar2 + uVar14,
                             pdVar2 + uVar9,pdVar3 + uVar14,pdVar3 + uVar9);
          local_7c = Costs::closestStateIndex(&cost,&theV,pOVar4->states,(uint)local_98);
          uVar14 = (ulong)local_ac;
          uVar11 = local_70;
        }
        else {
          local_7c = *(uint *)((long)pvVar6 + (ulong)(local_b0 - 1) * 4);
        }
        uVar8 = *(uint *)((long)pvVar6 + uVar14 * 4);
        if (local_7c < uVar8) {
          uVar8 = local_7c;
        }
        uVar9 = (ulong)uVar8;
        lVar12 = uVar9 * 8;
        while( true ) {
          pOVar4 = local_a0;
          uVar8 = *(uint *)((long)local_90 + uVar14 * 4);
          if (uVar8 <= local_7c) {
            uVar8 = local_7c;
          }
          if (uVar8 + 1 <= uVar9) break;
          uVar13 = uVar13 + 1;
          local_40 = local_a0->Q[uVar9][uVar14];
          ppdVar5 = local_a0->S12P;
          uVar10 = (ulong)local_b0;
          local_38 = lVar12;
          dVar15 = Costs::slopeCost(&cost,(double *)((long)local_a0->states + lVar12),
                                    local_a0->states + uVar11,&local_ac,&local_b0,*ppdVar5 + uVar14,
                                    *ppdVar5 + uVar10,ppdVar5[1] + uVar14,ppdVar5[1] + uVar10,
                                    ppdVar5[2] + uVar14,ppdVar5[2] + uVar10);
          dVar15 = dVar15 + local_40 + pOVar4->penalty;
          uVar14 = (ulong)local_ac;
          if (dVar15 < local_88) {
            local_a4 = (uint)uVar9;
            local_88 = dVar15;
            local_a8 = local_ac;
          }
          uVar9 = uVar9 + 1;
          lVar12 = local_38 + 8;
          uVar11 = local_70;
        }
        uVar14 = (ulong)((int)uVar14 + 1);
        pvVar6 = local_48;
      }
      local_a0->Q[uVar11][uVar9] = local_88;
      local_a0->lastChpt[uVar11][uVar9] = local_a8;
      local_a0->lastIndState[uVar11][local_b0] = local_a4;
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

void OmegaOP::algoChannel(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
      {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
      {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) ONLY between min(u1[t],indexTheV) and max(u2[t],indexTheV)
        for(unsigned int u = std::min(u1[t],indexTheV); u < std::max(u2[t],indexTheV) + 1; u++)
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}